

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::Pipeline::Pipeline(Pipeline *this,Arena *arena,bool is_message_owned)

{
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite,arena,is_message_owned);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__Pipeline_003fbb88;
  (this->models_).super_RepeatedPtrFieldBase.arena_ = arena;
  (this->models_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->models_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->models_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (this->names_).super_RepeatedPtrFieldBase.arena_ = arena;
  (this->names_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->names_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->names_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  return;
}

Assistant:

Pipeline::Pipeline(::PROTOBUF_NAMESPACE_ID::Arena* arena,
                         bool is_message_owned)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(arena, is_message_owned),
  models_(arena),
  names_(arena) {
  SharedCtor();
  if (!is_message_owned) {
    RegisterArenaDtor(arena);
  }
  // @@protoc_insertion_point(arena_constructor:CoreML.Specification.Pipeline)
}